

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildPlusMinus(CNscPStackEntry *pValue,int fPlus,int fPre)

{
  bool bVar1;
  CNscPStackEntry *this;
  uint uVar2;
  char *pcVar3;
  NscType nType;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pValue != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pValue->m_link,&g_pCtx->m_listEntryFree);
    }
    CNscPStackEntry::SetType(this,NscType_Unknown);
  }
  else {
    if (pValue == (CNscPStackEntry *)0x0) {
      __assert_fail("pValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0xa2e,"CNscPStackEntry *NscBuildPlusMinus(CNscPStackEntry *, int, int)");
    }
    nType = pValue->m_nType;
    if (nType != NscType_Error) {
      if ((nType == NscType_Integer) && (bVar1 = CNscPStackEntry::IsSimpleVariable(pValue), bVar1))
      {
        CNscPStackEntry::AppendData(this,pValue);
        uVar2 = (uint)(fPre == 0) * 4 + 4;
        if (fPlus == 0) {
          uVar2 = (uint)(fPre == 0) * 0x10 + 0x10;
        }
        *(uint *)(this->m_pauchData + 0x28) = *(uint *)(this->m_pauchData + 0x28) | uVar2;
        nType = NscType_Integer;
      }
      else {
        pcVar3 = "++";
        if (fPlus == 0) {
          pcVar3 = "--";
        }
        CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,pcVar3);
        nType = NscType_Error;
      }
    }
    CNscPStackEntry::SetType(this,nType);
    CNwnDoubleLinkList::InsertAfter(&pValue->m_link,&g_pCtx->m_listEntryFree);
  }
  return this;
}

Assistant:

YYSTYPE NscBuildPlusMinus (YYSTYPE pValue, int fPlus, int fPre)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pValue)
			g_pCtx ->FreePStackEntry (pValue);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Get the value
	//

	assert (pValue);

	//
	// Check for an error
	//

	NscType nType = pValue ->GetType ();
	if (nType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Process the operator
	//

	else if (nType == NscType_Integer && pValue ->IsSimpleVariable ())
	{
		pOut ->AppendData (pValue);
		NscPCodeVariable *pv = (NscPCodeVariable *) pOut ->GetData ();
		if (fPlus)
			pv ->ulFlags |= fPre ? NscSymFlag_PreIncrement : NscSymFlag_PostIncrement;
		else
			pv ->ulFlags |= fPre ? NscSymFlag_PreDecrement : NscSymFlag_PostDecrement;
		pOut ->SetType (nType);
	}
	else
	{
		g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, fPlus ? "++" : "--");
		pOut ->SetType (NscType_Error);
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pValue);
	return pOut;
}